

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O0

int MetadataCopy(char *metadata,size_t metadata_len,MetadataPayload *payload)

{
  void *pvVar1;
  long *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  int local_4;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == 0)) || (in_RDX == (long *)0x0)) {
    local_4 = 0;
  }
  else {
    pvVar1 = malloc(in_RSI);
    *in_RDX = (long)pvVar1;
    if (*in_RDX == 0) {
      local_4 = 0;
    }
    else {
      in_RDX[1] = in_RSI;
      memcpy((void *)*in_RDX,in_RDI,in_RSI);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int MetadataCopy(const char* metadata, size_t metadata_len,
                 MetadataPayload* const payload) {
  if (metadata == NULL || metadata_len == 0 || payload == NULL) return 0;
  payload->bytes = (uint8_t*)malloc(metadata_len);
  if (payload->bytes == NULL) return 0;
  payload->size = metadata_len;
  memcpy(payload->bytes, metadata, metadata_len);
  return 1;
}